

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QRegularExpression __thiscall QVariant::toRegularExpression(QVariant *this)

{
  QRegularExpressionPrivate *pQVar1;
  QRegularExpressionPrivate *pQVar2;
  bool bVar3;
  QRegularExpression *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QRegularExpression>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)((ulong)in_RSI[3].d.d.ptr & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((ulong)in_RSI[3].d.d.ptr & 1) != 0) {
      pQVar1 = (in_RSI->d).d.ptr;
      in_RSI = (QRegularExpression *)
               ((long)&(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value +
               (long)(int)(pQVar1->patternOptions).
                          super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                          super_QFlagsStorage<QRegularExpression::PatternOption>.i);
    }
    QRegularExpression::QRegularExpression((QRegularExpression *)this,in_RSI);
  }
  else {
    (this->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QRegularExpression::QRegularExpression((QRegularExpression *)this);
    pQVar1 = in_RSI[3].d.d.ptr;
    if (((ulong)pQVar1 & 1) != 0) {
      pQVar2 = (in_RSI->d).d.ptr;
      in_RSI = (QRegularExpression *)
               ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value +
               (long)(int)(pQVar2->patternOptions).
                          super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                          super_QFlagsStorage<QRegularExpression::PatternOption>.i);
    }
    QMetaType::convert((QMetaTypeInterface *)((ulong)pQVar1 & 0xfffffffffffffffc),in_RSI,local_20,
                       this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpression QVariant::toRegularExpression() const
{
    return qvariant_cast<QRegularExpression>(*this);
}